

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVerifier.cpp
# Opt level: O0

bool __thiscall llvm::DWARFVerifier::handleDebugInfo(DWARFVerifier *this)

{
  DWARFObject *pDVar1;
  anon_class_16_2_ac497184 local_60;
  undefined8 local_50;
  undefined8 local_48;
  anon_class_16_2_ac497184 local_40;
  undefined8 local_30;
  undefined8 local_28;
  uint local_1c;
  DWARFObject *pDStack_18;
  uint NumErrors;
  DWARFObject *DObj;
  DWARFVerifier *this_local;
  
  DObj = (DWARFObject *)this;
  pDStack_18 = DWARFContext::getDWARFObj(this->DCtx);
  local_1c = 0;
  raw_ostream::operator<<(this->OS,"Verifying .debug_info Unit Header Chain...\n");
  pDVar1 = pDStack_18;
  local_40.NumErrors = &local_1c;
  local_40.this = this;
  function_ref<void(llvm::DWARFSection_const&)>::
  function_ref<llvm::DWARFVerifier::handleDebugInfo()::__0>
            ((function_ref<void(llvm::DWARFSection_const&)> *)&local_30,&local_40,(type *)0x0);
  (*pDVar1->_vptr_DWARFObject[7])(pDVar1,local_30,local_28);
  raw_ostream::operator<<(this->OS,"Verifying .debug_types Unit Header Chain...\n");
  pDVar1 = pDStack_18;
  local_60.NumErrors = &local_1c;
  local_60.this = this;
  function_ref<void(llvm::DWARFSection_const&)>::
  function_ref<llvm::DWARFVerifier::handleDebugInfo()::__1>
            ((function_ref<void(llvm::DWARFSection_const&)> *)&local_50,&local_60,(type *)0x0);
  (*pDVar1->_vptr_DWARFObject[8])(pDVar1,local_50,local_48);
  return local_1c == 0;
}

Assistant:

bool DWARFVerifier::handleDebugInfo() {
  const DWARFObject &DObj = DCtx.getDWARFObj();
  unsigned NumErrors = 0;

  OS << "Verifying .debug_info Unit Header Chain...\n";
  DObj.forEachInfoSections([&](const DWARFSection &S) {
    NumErrors += verifyUnitSection(S, DW_SECT_INFO);
  });

  OS << "Verifying .debug_types Unit Header Chain...\n";
  DObj.forEachTypesSections([&](const DWARFSection &S) {
    NumErrors += verifyUnitSection(S, DW_SECT_TYPES);
  });
  return NumErrors == 0;
}